

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_family_from_id(int id,int *family,int *number)

{
  int ii;
  int *number_local;
  int *family_local;
  int id_local;
  
  for (ii = 0; xc_lda_known_funct[ii] != (xc_func_info_type *)0x0; ii = ii + 1) {
    if (xc_lda_known_funct[ii]->number == id) {
      if (family != (int *)0x0) {
        *family = 1;
      }
      if (number != (int *)0x0) {
        *number = ii;
      }
      return 1;
    }
  }
  for (ii = 0; xc_hyb_lda_known_funct[ii] != (xc_func_info_type *)0x0; ii = ii + 1) {
    if (xc_hyb_lda_known_funct[ii]->number == id) {
      if (family != (int *)0x0) {
        *family = 0x80;
      }
      if (number != (int *)0x0) {
        *number = ii;
      }
      return 0x80;
    }
  }
  for (ii = 0; xc_gga_known_funct[ii] != (xc_func_info_type *)0x0; ii = ii + 1) {
    if (xc_gga_known_funct[ii]->number == id) {
      if (family != (int *)0x0) {
        *family = 2;
      }
      if (number != (int *)0x0) {
        *number = ii;
      }
      return 2;
    }
  }
  for (ii = 0; xc_hyb_gga_known_funct[ii] != (xc_func_info_type *)0x0; ii = ii + 1) {
    if (xc_hyb_gga_known_funct[ii]->number == id) {
      if (family != (int *)0x0) {
        *family = 0x20;
      }
      if (number != (int *)0x0) {
        *number = ii;
      }
      return 0x20;
    }
  }
  for (ii = 0; xc_mgga_known_funct[ii] != (xc_func_info_type *)0x0; ii = ii + 1) {
    if (xc_mgga_known_funct[ii]->number == id) {
      if (family != (int *)0x0) {
        *family = 4;
      }
      if (number != (int *)0x0) {
        *number = ii;
      }
      return 4;
    }
  }
  ii = 0;
  while( true ) {
    if (xc_hyb_mgga_known_funct[ii] == (xc_func_info_type *)0x0) {
      return -1;
    }
    if (xc_hyb_mgga_known_funct[ii]->number == id) break;
    ii = ii + 1;
  }
  if (family != (int *)0x0) {
    *family = 0x40;
  }
  if (number != (int *)0x0) {
    *number = ii;
  }
  return 0x40;
}

Assistant:

int xc_family_from_id(int id, int *family, int *number)
{
  int ii;

  /* first let us check if it is an LDA */
  for(ii=0; xc_lda_known_funct[ii]!=NULL; ii++){
    if(xc_lda_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_LDA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_LDA;
    }
  }

  for(ii=0; xc_hyb_lda_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_lda_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_LDA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_LDA;
    }
  }

  /* or is it a GGA? */
  for(ii=0; xc_gga_known_funct[ii]!=NULL; ii++){
    if(xc_gga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_GGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_GGA;
    }
  }

  for(ii=0; xc_hyb_gga_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_gga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_GGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_GGA;
    }
  }

  /* or is it a meta GGA? */
  for(ii=0; xc_mgga_known_funct[ii]!=NULL; ii++){
    if(xc_mgga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_MGGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_MGGA;
    }
  }

  for(ii=0; xc_hyb_mgga_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_mgga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_MGGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_MGGA;
    }
  }

  return XC_FAMILY_UNKNOWN;
}